

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conveyer.cpp
# Opt level: O2

void Conveyer::printBinary(int numInTen)

{
  int i;
  uint uVar1;
  char *pcVar2;
  
  for (uVar1 = 0xb; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    pcVar2 = "1";
    if (((uint)numInTen >> (uVar1 & 0x1f) & 1) == 0) {
      pcVar2 = "0";
    }
    std::operator<<((ostream *)&std::cout,pcVar2);
    if ((uVar1 & 3) == 0) {
      std::operator<<((ostream *)&std::cout,"-");
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void Conveyer::printBinary(int numInTen) {
    for (int i = MAX_RESULT_DIGIT_INDEX; i >= 0; i--) {
        if (numInTen & (1 << i)) {
            cout << "1";
        } else cout << "0";
        if (i % 4 == 0)cout << "-";
    }
    cout << endl;
}